

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O0

void __thiscall
Centaurus::CompositeATN<unsigned_char>::CompositeATN
          (CompositeATN<unsigned_char> *this,Grammar<unsigned_char> *grammar)

{
  bool bVar1;
  unordered_map<Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>_>_>
  *this_00;
  reference __args;
  CATNMachine<unsigned_char> local_68;
  reference local_48;
  value_type *p;
  const_iterator __end0;
  const_iterator __begin0;
  unordered_map<Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>_>_>
  *__range2;
  Grammar<unsigned_char> *grammar_local;
  CompositeATN<unsigned_char> *this_local;
  
  this->_vptr_CompositeATN = (_func_int **)&PTR__CompositeATN_002564b8;
  std::
  unordered_map<Centaurus::Identifier,_Centaurus::CATNMachine<unsigned_char>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::CATNMachine<unsigned_char>_>_>_>
  ::unordered_map(&this->m_dict);
  this_00 = Grammar<unsigned_char>::get_machines(grammar);
  __end0 = std::
           unordered_map<Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>_>_>
           ::begin(this_00);
  p = (value_type *)
      std::
      unordered_map<Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>_>_>
      ::end(this_00);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end0.
                        super__Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>,_true>
                       ,(_Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>,_true>
                         *)&p);
    if (!bVar1) break;
    __args = std::__detail::
             _Node_const_iterator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>,_false,_true>
             ::operator*(&__end0);
    local_48 = __args;
    CATNMachine<unsigned_char>::CATNMachine(&local_68,&__args->second);
    std::
    unordered_map<Centaurus::Identifier,Centaurus::CATNMachine<unsigned_char>,std::hash<Centaurus::Identifier>,std::equal_to<Centaurus::Identifier>,std::allocator<std::pair<Centaurus::Identifier_const,Centaurus::CATNMachine<unsigned_char>>>>
    ::emplace<Centaurus::Identifier_const&,Centaurus::CATNMachine<unsigned_char>>
              ((unordered_map<Centaurus::Identifier,Centaurus::CATNMachine<unsigned_char>,std::hash<Centaurus::Identifier>,std::equal_to<Centaurus::Identifier>,std::allocator<std::pair<Centaurus::Identifier_const,Centaurus::CATNMachine<unsigned_char>>>>
                *)&this->m_dict,&__args->first,&local_68);
    CATNMachine<unsigned_char>::~CATNMachine(&local_68);
    std::__detail::
    _Node_const_iterator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>,_false,_true>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

CompositeATN(const Grammar<TCHAR>& grammar)
    {
        for (const auto& p : grammar.get_machines())
        {
            m_dict.emplace(p.first, CATNMachine<TCHAR>(p.second));
        }
    }